

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v7::detail::format_value<char,diy::Point<float,3u>>
               (buffer<char> *buf,Point<float,_3U> *value,locale_ref loc)

{
  bool bVar1;
  _Ios_Iostate _Var2;
  buffer<char> *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> output;
  formatbuf<char> format_buf;
  buffer<char> *in_stack_fffffffffffffe38;
  formatbuf<char> *in_stack_fffffffffffffe40;
  locale_ref *in_stack_fffffffffffffe48;
  size_t count;
  undefined4 in_stack_fffffffffffffe50;
  locale local_190 [8];
  locale local_188 [24];
  long local_170 [34];
  streambuf local_60 [80];
  buffer<char> *local_10;
  locale_ref local_8;
  
  local_10 = in_RDI;
  formatbuf<char>::formatbuf(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::ostream::ostream(local_170,local_60);
  bVar1 = locale_ref::operator_cast_to_bool(&local_8);
  if (bVar1) {
    locale_ref::get<std::locale>(in_stack_fffffffffffffe48);
    std::ios::imbue(local_188);
    std::locale::~locale(local_188);
    std::locale::~locale(local_190);
  }
  diy::operator<<((ostream *)in_stack_fffffffffffffe40,(Point<float,_3U> *)in_stack_fffffffffffffe38
                 );
  count = (long)local_170 + *(long *)(local_170[0] + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((_Ios_Iostate)count);
  buffer<char>::size(local_10);
  buffer<char>::try_resize((buffer<char> *)CONCAT44(_Var2,in_stack_fffffffffffffe50),count);
  std::ostream::~ostream(local_170);
  formatbuf<char>::~formatbuf((formatbuf<char> *)0x209b5a);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
#if !defined(FMT_STATIC_THOUSANDS_SEPARATOR)
  if (loc) output.imbue(loc.get<std::locale>());
#endif
  output << value;
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  buf.try_resize(buf.size());
}